

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLTest_DefaultVersion_Test::TestBody(SSLTest_DefaultVersion_Test *this)

{
  SSLTest_DefaultVersion_Test *this_local;
  
  ExpectDefaultVersion(0x303,0x304,TLS_method);
  ExpectDefaultVersion(0x301,0x301,TLSv1_method);
  ExpectDefaultVersion(0x302,0x302,TLSv1_1_method);
  ExpectDefaultVersion(0x303,0x303,TLSv1_2_method);
  ExpectDefaultVersion(0xfefd,0xfefd,DTLS_method);
  ExpectDefaultVersion(0xfeff,0xfeff,DTLSv1_method);
  ExpectDefaultVersion(0xfefd,0xfefd,DTLSv1_2_method);
  return;
}

Assistant:

TEST(SSLTest, DefaultVersion) {
  ExpectDefaultVersion(TLS1_2_VERSION, TLS1_3_VERSION, &TLS_method);
  ExpectDefaultVersion(TLS1_VERSION, TLS1_VERSION, &TLSv1_method);
  ExpectDefaultVersion(TLS1_1_VERSION, TLS1_1_VERSION, &TLSv1_1_method);
  ExpectDefaultVersion(TLS1_2_VERSION, TLS1_2_VERSION, &TLSv1_2_method);
  ExpectDefaultVersion(DTLS1_2_VERSION, DTLS1_2_VERSION, &DTLS_method);
  ExpectDefaultVersion(DTLS1_VERSION, DTLS1_VERSION, &DTLSv1_method);
  ExpectDefaultVersion(DTLS1_2_VERSION, DTLS1_2_VERSION, &DTLSv1_2_method);
}